

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::BitfieldExtractCase::BitfieldExtractCase
          (BitfieldExtractCase *this,Context *context,DataType baseType,Precision precision,
          ShaderType shaderType)

{
  char *name;
  VarType local_238;
  allocator<char> local_219;
  string local_218;
  Symbol local_1f8;
  VarType local_1c0;
  allocator<char> local_1a1;
  string local_1a0;
  Symbol local_180;
  VarType local_148;
  allocator<char> local_129;
  string local_128;
  Symbol local_108;
  VarType local_d0;
  allocator<char> local_b1;
  string local_b0;
  Symbol local_90;
  string local_48;
  ShaderType local_24;
  Precision local_20;
  ShaderType shaderType_local;
  Precision precision_local;
  DataType baseType_local;
  Context *context_local;
  BitfieldExtractCase *this_local;
  
  local_24 = shaderType;
  local_20 = precision;
  shaderType_local = baseType;
  _precision_local = context;
  context_local = (Context *)this;
  getIntegerFuncCaseName_abi_cxx11_
            (&local_48,(Functional *)(ulong)baseType,precision,shaderType,shaderType);
  name = (char *)std::__cxx11::string::c_str();
  IntegerFunctionCase::IntegerFunctionCase
            (&this->super_IntegerFunctionCase,context,name,"bitfieldExtract",local_24);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_IntegerFunctionCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BitfieldExtractCase_011c39e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"value",&local_b1);
  glu::VarType::VarType(&local_d0,shaderType_local,local_20);
  gls::ShaderExecUtil::Symbol::Symbol(&local_90,&local_b0,&local_d0);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::push_back(&(this->super_IntegerFunctionCase).m_spec.inputs,&local_90);
  gls::ShaderExecUtil::Symbol::~Symbol(&local_90);
  glu::VarType::~VarType(&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"offset",&local_129);
  glu::VarType::VarType(&local_148,TYPE_INT,local_20);
  gls::ShaderExecUtil::Symbol::Symbol(&local_108,&local_128,&local_148);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::push_back(&(this->super_IntegerFunctionCase).m_spec.inputs,&local_108);
  gls::ShaderExecUtil::Symbol::~Symbol(&local_108);
  glu::VarType::~VarType(&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"bits",&local_1a1);
  glu::VarType::VarType(&local_1c0,TYPE_INT,local_20);
  gls::ShaderExecUtil::Symbol::Symbol(&local_180,&local_1a0,&local_1c0);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::push_back(&(this->super_IntegerFunctionCase).m_spec.inputs,&local_180);
  gls::ShaderExecUtil::Symbol::~Symbol(&local_180);
  glu::VarType::~VarType(&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"extracted",&local_219);
  glu::VarType::VarType(&local_238,shaderType_local,local_20);
  gls::ShaderExecUtil::Symbol::Symbol(&local_1f8,&local_218,&local_238);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::push_back(&(this->super_IntegerFunctionCase).m_spec.outputs,&local_1f8);
  gls::ShaderExecUtil::Symbol::~Symbol(&local_1f8);
  glu::VarType::~VarType(&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  std::__cxx11::string::operator=
            ((string *)&(this->super_IntegerFunctionCase).m_spec.source,
             "extracted = bitfieldExtract(value, offset, bits);");
  return;
}

Assistant:

BitfieldExtractCase (Context& context, glu::DataType baseType, glu::Precision precision, glu::ShaderType shaderType)
		: IntegerFunctionCase(context, getIntegerFuncCaseName(baseType, precision, shaderType).c_str(), "bitfieldExtract", shaderType)
	{
		m_spec.inputs.push_back(Symbol("value", glu::VarType(baseType, precision)));
		m_spec.inputs.push_back(Symbol("offset", glu::VarType(glu::TYPE_INT, precision)));
		m_spec.inputs.push_back(Symbol("bits", glu::VarType(glu::TYPE_INT, precision)));
		m_spec.outputs.push_back(Symbol("extracted", glu::VarType(baseType, precision)));
		m_spec.source = "extracted = bitfieldExtract(value, offset, bits);";
	}